

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  DenseMatrix *this_00;
  int64_t iVar1;
  Matrix *this_01;
  Matrix *pMVar2;
  real *prVar3;
  int in_EDX;
  long in_RDI;
  int64_t j;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  real in_stack_ffffffffffffffc4;
  Matrix *in_stack_ffffffffffffffc8;
  long local_20;
  
  if (in_EDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x84,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  this_00 = (DenseMatrix *)(long)in_EDX;
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if ((long)this_00 < iVar1) {
    this_01 = (Matrix *)Vector::size((Vector *)0x1e0a64);
    pMVar2 = (Matrix *)
             Matrix::size(this_01,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (this_01 == pMVar2) {
      for (local_20 = 0; local_20 < *(long *)(in_RDI + 0x10); local_20 = local_20 + 1) {
        prVar3 = at(this_00,(int64_t)this_01,
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc4 = *prVar3;
        prVar3 = Vector::operator[]((Vector *)
                                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                    in_stack_ffffffffffffffb8);
        *prVar3 = in_stack_ffffffffffffffc4 + *prVar3;
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x86,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x85,"virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += at(i, j);
  }
}